

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O3

ListOverlay * __thiscall cursespp::ListOverlay::SetSelectedIndex(ListOverlay *this,size_t index)

{
  element_type *peVar1;
  char cVar2;
  
  (**(code **)(*(long *)&(((this->listWindow).
                           super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->super_ListWindow).super_ScrollableWindow.super_Window.
                         super_IWindow.super_IOrderable + 0x230))();
  peVar1 = (this->listWindow).
           super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  cVar2 = (**(code **)(*(long *)&(peVar1->super_ListWindow).super_ScrollableWindow.super_Window.
                                 super_IWindow.super_IOrderable + 0x238))(peVar1,index);
  if (cVar2 == '\0') {
    peVar1 = (this->listWindow).
             super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**(code **)(*(long *)&(peVar1->super_ListWindow).super_ScrollableWindow.super_Window.
                           super_IWindow.super_IOrderable + 0x220))(peVar1,index);
  }
  return this;
}

Assistant:

ListOverlay& ListOverlay::SetSelectedIndex(size_t index) {
    this->listWindow->SetSelectedIndex(index);

    if (!this->listWindow->IsEntryVisible(index)) {
        this->listWindow->ScrollTo(index);
    }

    return *this;
}